

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

long dprintf_DollarString(char *input,char **end)

{
  byte bVar1;
  uint uVar2;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  ppuVar3 = __ctype_b_loc();
  uVar5 = (ulong)(byte)*input;
  uVar4 = 0;
  if ((*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 8) != 0) {
    pbVar6 = (byte *)(input + 1);
    do {
      uVar2 = ((int)(char)uVar5 + (int)uVar4 * 10) - 0x30;
      uVar4 = (ulong)uVar2;
      bVar1 = *pbVar6;
      uVar5 = (ulong)bVar1;
      pbVar6 = pbVar6 + 1;
    } while ((*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 8) != 0);
    if (bVar1 == 0x24 && uVar2 != 0) {
      *end = (char *)pbVar6;
      uVar4 = (ulong)(int)uVar2;
    }
    else {
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number=0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}